

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

trex * __thiscall
fmp4_stream::init_fragment::get_trex(trex *__return_storage_ptr__,init_fragment *this)

{
  pointer in;
  uint uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  bool bVar27;
  bool bVar28;
  ulong uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  allocator<char> local_a9;
  pointer local_a8;
  pointer local_a0;
  trex *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a8 = (this->moov_box_).box_data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = local_a8 + 4;
  uVar29 = 8;
  bVar27 = false;
  local_98 = __return_storage_ptr__;
  do {
    in = local_a0 + uVar29;
    do {
      if (bVar27 != false) {
        uVar30 = (int)uVar29 + 8;
        bVar27 = false;
        goto LAB_0010affb;
      }
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar29) goto LAB_0010b0d2;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"trak",&local_a9);
      bVar27 = f_compare_4cc((char *)in,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    } while (bVar27);
    uVar30 = *(uint *)(local_a8 + uVar29);
    uVar29 = (ulong)((uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 |
                     uVar30 << 0x18) + (int)uVar29);
  } while( true );
LAB_0010affb:
  if (bVar27) {
    uVar30 = uVar30 + 8;
    bVar27 = false;
    while( true ) {
      uVar29 = (ulong)uVar30;
      if (bVar27) {
        auVar31 = *(undefined1 (*) [16])(local_a8 + uVar29 + 0xc);
        auVar33[1] = 0;
        auVar33[0] = auVar31[8];
        auVar33[2] = auVar31[9];
        auVar33[3] = 0;
        auVar33[4] = auVar31[10];
        auVar33[5] = 0;
        auVar33[6] = auVar31[0xb];
        auVar33[7] = 0;
        auVar33[8] = auVar31[0xc];
        auVar33[9] = 0;
        auVar33[10] = auVar31[0xd];
        auVar33[0xb] = 0;
        auVar33[0xc] = auVar31[0xe];
        auVar33[0xd] = 0;
        auVar33[0xe] = auVar31[0xf];
        auVar33[0xf] = 0;
        auVar32 = pshuflw(auVar33,auVar33,0x1b);
        auVar33 = pshufhw(auVar32,auVar32,0x1b);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar31._0_13_;
        auVar18[0xe] = auVar31[7];
        auVar19[0xc] = auVar31[6];
        auVar19._0_12_ = auVar31._0_12_;
        auVar19._13_2_ = auVar18._13_2_;
        auVar20[0xb] = 0;
        auVar20._0_11_ = auVar31._0_11_;
        auVar20._12_3_ = auVar19._12_3_;
        auVar21[10] = auVar31[5];
        auVar21._0_10_ = auVar31._0_10_;
        auVar21._11_4_ = auVar20._11_4_;
        auVar22[9] = 0;
        auVar22._0_9_ = auVar31._0_9_;
        auVar22._10_5_ = auVar21._10_5_;
        auVar23[8] = auVar31[4];
        auVar23._0_8_ = auVar31._0_8_;
        auVar23._9_6_ = auVar22._9_6_;
        auVar24._7_8_ = 0;
        auVar24._0_7_ = auVar23._8_7_;
        auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
        auVar25[0] = auVar31[3];
        auVar25._9_6_ = 0;
        auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar26[0] = auVar31[2];
        auVar26._11_4_ = 0;
        auVar32._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar32[2] = auVar31[1];
        auVar32[0] = auVar31[0];
        auVar32[1] = 0;
        auVar32[0xf] = 0;
        auVar31 = pshuflw(auVar32,auVar32,0x1b);
        auVar31 = pshufhw(auVar31,auVar31,0x1b);
        sVar2 = auVar31._0_2_;
        sVar3 = auVar31._2_2_;
        sVar4 = auVar31._4_2_;
        sVar5 = auVar31._6_2_;
        sVar6 = auVar31._8_2_;
        sVar7 = auVar31._10_2_;
        sVar8 = auVar31._12_2_;
        sVar9 = auVar31._14_2_;
        sVar10 = auVar33._0_2_;
        sVar11 = auVar33._2_2_;
        sVar12 = auVar33._4_2_;
        sVar13 = auVar33._6_2_;
        sVar14 = auVar33._8_2_;
        sVar15 = auVar33._10_2_;
        sVar16 = auVar33._12_2_;
        sVar17 = auVar33._14_2_;
        *(char *)&local_98->track_id_ = (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] - (0xff < sVar2);
        *(char *)((long)&local_98->track_id_ + 1) =
             (0 < sVar3) * (sVar3 < 0x100) * auVar31[2] - (0xff < sVar3);
        *(char *)((long)&local_98->track_id_ + 2) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4);
        *(char *)((long)&local_98->track_id_ + 3) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5);
        *(char *)&local_98->default_sample_description_index_ =
             (0 < sVar6) * (sVar6 < 0x100) * auVar31[8] - (0xff < sVar6);
        *(char *)((long)&local_98->default_sample_description_index_ + 1) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar31[10] - (0xff < sVar7);
        *(char *)((long)&local_98->default_sample_description_index_ + 2) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar31[0xc] - (0xff < sVar8);
        *(char *)((long)&local_98->default_sample_description_index_ + 3) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar31[0xe] - (0xff < sVar9);
        *(char *)&local_98->default_sample_duration_ =
             (0 < sVar10) * (sVar10 < 0x100) * auVar33[0] - (0xff < sVar10);
        *(char *)((long)&local_98->default_sample_duration_ + 1) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar33[2] - (0xff < sVar11);
        *(char *)((long)&local_98->default_sample_duration_ + 2) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar33[4] - (0xff < sVar12);
        *(char *)((long)&local_98->default_sample_duration_ + 3) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar33[6] - (0xff < sVar13);
        *(char *)&local_98->default_sample_size_ =
             (0 < sVar14) * (sVar14 < 0x100) * auVar33[8] - (0xff < sVar14);
        *(char *)((long)&local_98->default_sample_size_ + 1) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar33[10] - (0xff < sVar15);
        *(char *)((long)&local_98->default_sample_size_ + 2) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar33[0xc] - (0xff < sVar16);
        *(char *)((long)&local_98->default_sample_size_ + 3) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar33[0xe] - (0xff < sVar17);
        uVar30 = *(uint *)(local_a8 + uVar29 + 0x1c);
        local_98->default_sample_flags_ =
             uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 | uVar30 << 0x18;
        return local_98;
      }
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar29) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"trex",&local_a9);
      bVar28 = f_compare_4cc((char *)(local_a0 + uVar29),&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar28) {
        bVar27 = true;
      }
      else {
        uVar1 = *(uint *)(local_a8 + uVar29);
        uVar30 = uVar30 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                          uVar1 << 0x18);
      }
    }
LAB_0010b0d2:
    local_98->track_id_ = 0;
    local_98->default_sample_description_index_ = 0;
    local_98->default_sample_duration_ = 0;
    local_98->default_sample_size_ = 0;
    local_98->default_sample_flags_ = 0;
    return local_98;
  }
  uVar29 = (ulong)uVar30;
  if ((ulong)((long)(this->moov_box_).box_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->moov_box_).box_data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= uVar29) goto LAB_0010b0d2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"mvex",&local_a9);
  bVar28 = f_compare_4cc((char *)(local_a0 + uVar29),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar28) {
    bVar27 = true;
  }
  else {
    uVar1 = *(uint *)(local_a8 + uVar29);
    uVar30 = uVar30 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
  }
  goto LAB_0010affb;
}

Assistant:

trex init_fragment::get_trex()
	{
		char* ptr = (char*)moov_box_.box_data_.data();
		bool trak_found = false;
		bool mvex_found = false;
		bool trex_found = false;


		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while (!mvex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mvex"))
					mvex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mvex_found)
		{
			pos += 8;
			while (!trex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "trex"))
					trex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (trex_found)
		{
			trex t = {}; 
			// uint32_t track_id_;
			// uint32_t default_sample_description_index_;
			// uint32_t default_sample_duration_;
			// uint32_t default_sample_size_;
			// uint32_t default_sample_flags_;
			t.track_id_ = fmp4_read_uint32(ptr + pos + 12);
			t.default_sample_description_index_ = fmp4_read_uint32(ptr + pos + 16);
			t.default_sample_duration_ = fmp4_read_uint32(ptr + pos + 20);
			t.default_sample_size_ = fmp4_read_uint32(ptr + pos + 24);
			t.default_sample_flags_ = fmp4_read_uint32(ptr + pos + 28);
			
			return t;
		}
		trex t = {};
		
		return t;

	}